

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

bool __thiscall WndRect::keepOnScreen(WndRect *this)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  WndRect *in_RDI;
  WndRect screen;
  bool bChanged;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  WndRect local_1c;
  byte local_9;
  
  local_9 = 0;
  WndRect((WndRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  piVar2 = left(&local_1c);
  piVar3 = top(&local_1c);
  piVar4 = right(&local_1c);
  piVar5 = bottom(&local_1c);
  XPLMGetScreenBoundsGlobal(piVar2,piVar3,piVar4,piVar5);
  piVar2 = right(in_RDI);
  iVar1 = *piVar2;
  piVar2 = right(&local_1c);
  if (*piVar2 < iVar1) {
    right(&local_1c);
    right(in_RDI);
    shift((WndRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_9 = 1;
  }
  piVar2 = left(in_RDI);
  iVar1 = *piVar2;
  piVar2 = left(&local_1c);
  if (iVar1 < *piVar2) {
    left(&local_1c);
    left(in_RDI);
    shift((WndRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_9 = 1;
  }
  piVar2 = bottom(in_RDI);
  iVar1 = *piVar2;
  piVar2 = bottom(&local_1c);
  if (iVar1 < *piVar2) {
    bottom(&local_1c);
    bottom(in_RDI);
    shift((WndRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_9 = 1;
  }
  piVar2 = top(in_RDI);
  iVar1 = *piVar2;
  piVar2 = top(&local_1c);
  if (*piVar2 + -0x32 < iVar1) {
    piVar2 = top(&local_1c);
    iVar1 = *piVar2 + -0x32;
    top(in_RDI);
    shift((WndRect *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,
          in_stack_ffffffffffffff98);
    local_9 = 1;
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool WndRect::keepOnScreen ()
{
    bool bChanged = false;
    WndRect screen;
    XPLMGetScreenBoundsGlobal(&screen.left(), &screen.top(),
                              &screen.right(), &screen.bottom());


    if (right() > screen.right()) {
        shift(screen.right() - right(), 0);
        bChanged = true;
    }
    if (left() < screen.left()) {
        shift(screen.left() - left(), 0);
        bChanged = true;
    }
    if (bottom() < screen.bottom()) {
        shift(0, screen.bottom() - bottom());
        bChanged = true;
    }
    if (top() > screen.top() - WIN_FROM_TOP) {
        shift(0, screen.top() - WIN_FROM_TOP - top());
        bChanged = true;
    }
    // Did we change any value?
    return bChanged;
}